

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void bounty_log(char *string)

{
  char *__s;
  size_t sVar1;
  FILE *__stream;
  
  __s = ctime(&current_time);
  sVar1 = strlen(__s);
  __s[sVar1 - 1] = '\0';
  __stream = fopen("../logs/bounties.txt","a");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s :: %s\n",__s,string);
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void bounty_log(char *string)
{
	FILE *fp;
	char *strtime;

	strtime = ctime(&current_time);
	strtime[strlen(strtime) - 1] = '\0';

	fp = fopen(BOUNTY_LOG_FILE, "a");
	if (fp != nullptr)
	{
		fprintf(fp, "%s :: %s\n", strtime, string);
		fclose(fp);
	}
}